

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_mnist.cpp
# Opt level: O2

void printStats(Net *net,LabeledDataset *testSet,IntClassifier *metrics)

{
  ostream *poVar1;
  float fVar2;
  double dVar3;
  ConfusionMatrix<int,_1> cm;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  _Stack_48;
  
  (*(metrics->super_AClassifier<int,_1>)._vptr_AClassifier[2])(&_Stack_48,metrics,testSet);
  poVar1 = std::operator<<((ostream *)&std::cout,"E = ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 6;
  fVar2 = meanLossEstimate(net,testSet,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"PPV = ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  dVar3 = notch::metrics::ConfusionMatrix<int,_1>::precision((ConfusionMatrix<int,_1> *)&_Stack_48);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"TPR = ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  dVar3 = notch::metrics::ConfusionMatrix<int,_1>::recall((ConfusionMatrix<int,_1> *)&_Stack_48);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"ACC = ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  dVar3 = notch::metrics::ConfusionMatrix<int,_1>::accuracy((ConfusionMatrix<int,_1> *)&_Stack_48);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"F1 = ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  dVar3 = notch::metrics::ConfusionMatrix<int,_1>::F1score((ConfusionMatrix<int,_1> *)&_Stack_48);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  notch::core::std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::~_Rb_tree(&_Stack_48);
  return;
}

Assistant:

void printStats(Net &net, LabeledDataset &testSet, IntClassifier &metrics) {
    auto cm = metrics.test(testSet);
    cout << "E = "
        << setprecision(6)
        << meanLossEstimate(net, testSet) << " "
        << "PPV = "
        << setprecision(3)
        << cm.precision() << " "
        << "TPR = "
        << setprecision(3)
        << cm.recall() << " "
        << "ACC = "
        << setprecision(3)
        << cm.accuracy() << " "
        << "F1 = "
        << setprecision(3)
        << cm.F1score() << endl;
}